

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clump.cpp
# Opt level: O1

void __thiscall rw::Clump::destroy(Clump *this)

{
  LLLink *pLVar1;
  LLLink *pLVar2;
  Frame *this_00;
  LLLink *pLVar3;
  
  PluginList::destruct((PluginList *)&s_plglist,this);
  pLVar3 = (this->atomics).link.next;
  while (pLVar3 != &(this->atomics).link) {
    pLVar1 = pLVar3->next;
    pLVar2 = pLVar3->prev;
    pLVar2->next = pLVar1;
    pLVar3->next->prev = pLVar2;
    pLVar3[-1].prev = (LLLink *)0x0;
    Atomic::destroy((Atomic *)&pLVar3[-6].prev);
    pLVar3 = pLVar1;
  }
  pLVar3 = (this->lights).link.next;
  while (pLVar3 != &(this->lights).link) {
    pLVar1 = pLVar3->next;
    pLVar2 = pLVar3->prev;
    pLVar2->next = pLVar1;
    pLVar3->next->prev = pLVar2;
    pLVar3[-1].prev = (LLLink *)0x0;
    Light::destroy((Light *)&pLVar3[-6].prev);
    pLVar3 = pLVar1;
  }
  pLVar3 = (this->cameras).link.next;
  while (pLVar3 != &(this->cameras).link) {
    pLVar1 = pLVar3->next;
    pLVar2 = pLVar3->prev;
    pLVar2->next = pLVar1;
    pLVar3->next->prev = pLVar2;
    pLVar3[-1].prev = (LLLink *)0x0;
    Camera::destroy((Camera *)&pLVar3[-0x23].prev);
    pLVar3 = pLVar1;
  }
  this_00 = (Frame *)(this->object).parent;
  if (this_00 != (Frame *)0x0) {
    Frame::destroyHierarchy(this_00);
  }
  (*DAT_00149de0)(this);
  numAllocated = numAllocated + -1;
  return;
}

Assistant:

void
Clump::destroy(void)
{
	Frame *f;
	s_plglist.destruct(this);
	FORLIST(lnk, this->atomics){
		Atomic *a = Atomic::fromClump(lnk);
		this->removeAtomic(a);
		a->destroy();
	}
	FORLIST(lnk, this->lights){
		Light *l = Light::fromClump(lnk);
		this->removeLight(l);
		l->destroy();
	}
	FORLIST(lnk, this->cameras){
		Camera *c = Camera::fromClump(lnk);
		this->removeCamera(c);
		c->destroy();
	}
	if(f = this->getFrame(), f)
		f->destroyHierarchy();
	assert(this->world == nil);
	rwFree(this);
	numAllocated--;
}